

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest20_21::getShaders
          (FunctionalTest20_21 *this,GLchar **out_vertex_shader_code,
          GLchar **out_tesselation_control_shader_code,
          GLchar **out_tesselation_evaluation_shader_code,GLchar **out_geometry_shader_code,
          GLchar **out_fragment_shader_code)

{
  GLchar **out_fragment_shader_code_local;
  GLchar **out_geometry_shader_code_local;
  GLchar **out_tesselation_evaluation_shader_code_local;
  GLchar **out_tesselation_control_shader_code_local;
  GLchar **out_vertex_shader_code_local;
  FunctionalTest20_21 *this_local;
  
  *out_vertex_shader_code = getShaders::vertex_shader_code;
  *out_tesselation_control_shader_code = getShaders::tesselation_control_shader_code;
  *out_tesselation_evaluation_shader_code = getShaders::tesselation_evaluation_shader_code;
  *out_geometry_shader_code = getShaders::geometry_shader_code;
  *out_fragment_shader_code = getShaders::fragmenty_shader_code;
  return;
}

Assistant:

void FunctionalTest20_21::getShaders(const glw::GLchar*& out_vertex_shader_code,
									 const glw::GLchar*& out_tesselation_control_shader_code,
									 const glw::GLchar*& out_tesselation_evaluation_shader_code,
									 const glw::GLchar*& out_geometry_shader_code,
									 const glw::GLchar*& out_fragment_shader_code)
{
	static const GLchar* vertex_shader_code = "#version 400 core\n"
											  "#extension GL_ARB_shader_subroutine : require\n"
											  "\n"
											  "precision highp float;\n"
											  "\n"
											  "// Subroutine type\n"
											  "subroutine vec4 routine_type(in vec4 left, in vec4 right);\n"
											  "\n"
											  "// Subroutine definition\n"
											  "subroutine(routine_type) vec4 add(in vec4 left, in vec4 right)\n"
											  "{\n"
											  "    return left + right;\n"
											  "}\n"
											  "\n"
											  "subroutine(routine_type) vec4 multiply(in vec4 left, in vec4 right)\n"
											  "{\n"
											  "    return left * right;\n"
											  "}\n"
											  "\n"
											  "// Sub routine uniform\n"
											  "subroutine uniform routine_type routine;\n"
											  "\n"
											  "// Input data\n"
											  "uniform vec4 uni_vs_left;\n"
											  "uniform vec4 uni_vs_right;\n"
											  "\n"
											  "// Output\n"
											  "out vec4 vs_tcs_result;\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "    vs_tcs_result = routine(uni_vs_left, uni_vs_right);\n"
											  "}\n"
											  "\n";

	static const GLchar* tesselation_control_shader_code =
		"#version 400 core\n"
		"#extension GL_ARB_shader_subroutine : require\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"layout(vertices = 1) out;\n"
		"\n"
		"// Subroutine type\n"
		"subroutine vec4 routine_type(in vec4 left, in vec4 right);\n"
		"\n"
		"// Subroutine definition\n"
		"subroutine(routine_type) vec4 add(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return left + right;\n"
		"}\n"
		"\n"
		"subroutine(routine_type) vec4 multiply(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return left * right;\n"
		"}\n"
		"\n"
		"// Sub routine uniform\n"
		"subroutine uniform routine_type routine;\n"
		"\n"
		"// Input data\n"
		"uniform vec4 uni_tcs_left;\n"
		"uniform vec4 uni_tcs_right;\n"
		"\n"
		"in vec4 vs_tcs_result[];\n"
		"\n"
		"// Output\n"
		"out vec4 tcs_tes_result[];\n"
		"\n"
		"void main()\n"
		"{\n"
		"    gl_TessLevelOuter[0] = 1.0;\n"
		"    gl_TessLevelOuter[1] = 1.0;\n"
		"    gl_TessLevelOuter[2] = 1.0;\n"
		"    gl_TessLevelOuter[3] = 1.0;\n"
		"    gl_TessLevelInner[0] = 1.0;\n"
		"    gl_TessLevelInner[1] = 1.0;\n"
		"\n"
		"    tcs_tes_result[gl_InvocationID] = routine(uni_tcs_left, uni_tcs_right) + vs_tcs_result[gl_InvocationID];\n"
		"}\n"
		"\n";

	static const GLchar* tesselation_evaluation_shader_code =
		"#version 400 core\n"
		"#extension GL_ARB_shader_subroutine : require\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"layout(isolines, point_mode) in;\n"
		"\n"
		"// Subroutine type\n"
		"subroutine vec4 routine_type(in vec4 left, in vec4 right);\n"
		"\n"
		"// Subroutine definition\n"
		"subroutine(routine_type) vec4 add(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return left + right;\n"
		"}\n"
		"\n"
		"subroutine(routine_type) vec4 multiply(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return left * right;\n"
		"}\n"
		"\n"
		"// Sub routine uniform\n"
		"subroutine uniform routine_type routine;\n"
		"\n"
		"// Input data\n"
		"uniform vec4 uni_tes_left;\n"
		"uniform vec4 uni_tes_right;\n"
		"\n"
		"in vec4 tcs_tes_result[];\n"
		"\n"
		"// Output\n"
		"out vec4 tes_gs_result;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    tes_gs_result = routine(uni_tes_left, uni_tes_right) + tcs_tes_result[0];\n"
		"}\n"
		"\n";

	static const GLchar* geometry_shader_code =
		"#version 400 core\n"
		"#extension GL_ARB_shader_subroutine : require\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"layout(points)                   in;\n"
		"layout(points, max_vertices = 1) out;\n"
		"\n"
		"// Subroutine type\n"
		"subroutine vec4 routine_type(in vec4 left, in vec4 right);\n"
		"\n"
		"// Subroutine definition\n"
		"subroutine(routine_type) vec4 add(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return left + right;\n"
		"}\n"
		"\n"
		"subroutine(routine_type) vec4 multiply(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return left * right;\n"
		"}\n"
		"\n"
		"// Sub routine uniform\n"
		"subroutine uniform routine_type routine;\n"
		"\n"
		"// Input data\n"
		"uniform vec4 uni_gs_left;\n"
		"uniform vec4 uni_gs_right;\n"
		"\n"
		"in vec4 tes_gs_result[];\n"
		"\n"
		"// Output\n"
		"out vec4 gs_fs_result;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    gs_fs_result = routine(uni_gs_left, uni_gs_right) + tes_gs_result[0];\n"
		"}\n"
		"\n";

	static const GLchar* fragmenty_shader_code =
		"#version 400 core\n"
		"#extension GL_ARB_shader_subroutine : require\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"// Subroutine type\n"
		"subroutine vec4 routine_type(in vec4 left, in vec4 right);\n"
		"\n"
		"// Subroutine definition\n"
		"subroutine(routine_type) vec4 add(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return left + right;\n"
		"}\n"
		"\n"
		"subroutine(routine_type) vec4 multiply(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return left * right;\n"
		"}\n"
		"\n"
		"// Sub routine uniform\n"
		"subroutine uniform routine_type routine;\n"
		"\n"
		"// Input data\n"
		"uniform vec4 uni_fs_left;\n"
		"uniform vec4 uni_fs_right;\n"
		"\n"
		"in vec4 gs_fs_result;\n"
		"\n"
		"// Output\n"
		"out vec4 fs_out_result;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    fs_out_result = routine(uni_fs_left, uni_fs_right) + gs_fs_result;\n"
		"}\n"
		"\n";

	out_vertex_shader_code				   = vertex_shader_code;
	out_tesselation_control_shader_code	= tesselation_control_shader_code;
	out_tesselation_evaluation_shader_code = tesselation_evaluation_shader_code;
	out_geometry_shader_code			   = geometry_shader_code;
	out_fragment_shader_code			   = fragmenty_shader_code;
}